

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
Corrade::Containers::Implementation::
CallDeleter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
::operator()(CallDeleter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
             *this,_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_size_t
                   *deleter,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,
            size_t size)

{
  pointer pcVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  if (deleter !=
      (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_size_t *)0x0
     ) {
    (*deleter)(data,size);
    return;
  }
  if (data != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    lVar2 = *(long *)((long)&data[-1].field_2 + 8);
    if (lVar2 != 0) {
      paVar3 = &data[lVar2 + -1].field_2;
      lVar2 = lVar2 * -0x20;
      do {
        pcVar1 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (paVar3 + -1))->_M_dataplus)._M_p;
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar1) {
          operator_delete(pcVar1);
        }
        paVar3 = paVar3 + -2;
        lVar2 = lVar2 + 0x20;
      } while (lVar2 != 0);
    }
    operator_delete__((void *)((long)&data[-1].field_2 + 8));
    return;
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }